

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O0

void __thiscall HFactor::btranAPF(HFactor *this,HVector *vector)

{
  HighsInt X_Start;
  HighsInt x_end;
  HighsInt y_start;
  HighsInt y_end;
  int *rhs_index_00;
  double *rhs_array_00;
  size_type sVar1;
  const_reference pvVar2;
  int *t_index;
  double *t_value;
  const_reference pvVar3;
  long in_RSI;
  long in_RDI;
  HighsInt i;
  HighsInt pf_pivot_count;
  double *rhs_array;
  HighsInt *rhs_index;
  HighsInt rhs_count;
  int local_30;
  HighsInt local_14;
  long local_10;
  
  local_14 = *(HighsInt *)(in_RSI + 4);
  local_10 = in_RSI;
  rhs_index_00 = std::vector<int,_std::allocator<int>_>::data
                           ((vector<int,_std::allocator<int>_> *)0x7d4bb2);
  rhs_array_00 = std::vector<double,_std::allocator<double>_>::data
                           ((vector<double,_std::allocator<double>_> *)0x7d4bc5);
  sVar1 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x650));
  for (local_30 = 0; local_30 < (int)sVar1; local_30 = local_30 + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x680),(long)(local_30 << 1))
    ;
    X_Start = *pvVar2;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x680),
                        (long)(local_30 * 2 + 1));
    x_end = *pvVar2;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x680),
                        (long)(local_30 * 2 + 1));
    y_start = *pvVar2;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x680),
                        (long)(local_30 * 2 + 2));
    y_end = *pvVar2;
    t_index = std::vector<int,_std::allocator<int>_>::data
                        ((vector<int,_std::allocator<int>_> *)0x7d4c8f);
    t_value = std::vector<double,_std::allocator<double>_>::data
                        ((vector<double,_std::allocator<double>_> *)0x7d4ca5);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x650),(long)local_30);
    solveMatrixT(X_Start,x_end,y_start,y_end,t_index,t_value,*pvVar3,&local_14,rhs_index_00,
                 rhs_array_00);
  }
  *(HighsInt *)(local_10 + 4) = local_14;
  return;
}

Assistant:

void HFactor::btranAPF(HVector& vector) const {
  // Alias to non constant
  HighsInt rhs_count = vector.count;
  HighsInt* rhs_index = vector.index.data();
  double* rhs_array = vector.array.data();

  // Forwardly
  HighsInt pf_pivot_count = pf_pivot_value.size();
  for (HighsInt i = 0; i < pf_pivot_count; i++) {
    solveMatrixT(pf_start[i * 2], pf_start[i * 2 + 1], pf_start[i * 2 + 1],
                 pf_start[i * 2 + 2], pf_index.data(), pf_value.data(),
                 pf_pivot_value[i], &rhs_count, rhs_index, rhs_array);
  }
  vector.count = rhs_count;
}